

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGen_X86.cpp
# Opt level: O3

void __thiscall
CodeGenGenericContext::RedirectAddressComputation
          (CodeGenGenericContext *this,x86Reg *index,int *multiplier,x86Reg *base,uint *shift)

{
  x86Reg xVar1;
  ulong uVar2;
  ArgType AVar3;
  
  if (this->genReg[*index].type == argReg) {
    *index = this->genReg[*index].field_1.reg;
  }
  uVar2 = (ulong)*base;
  AVar3 = this->genReg[uVar2].type;
  if (AVar3 == argReg) {
    xVar1 = this->genReg[uVar2].field_1.reg;
    uVar2 = (ulong)xVar1;
    *base = xVar1;
    AVar3 = this->genReg[uVar2].type;
  }
  if (AVar3 == argNumber) {
    *shift = *shift + this->genReg[uVar2].field_1.reg;
    *base = rNONE;
  }
  if (this->genReg[*index].type == argNumber) {
    *shift = *shift + *multiplier * this->genReg[*index].field_1.reg;
    *multiplier = 1;
    *index = rNONE;
  }
  return;
}

Assistant:

void CodeGenGenericContext::RedirectAddressComputation(x86Reg &index, int &multiplier, x86Reg &base, unsigned &shift)
{
	// If selected index register contains the value of another register, use it instead
	if(genReg[index].type == x86Argument::argReg)
	{
		index = genReg[index].reg;
	}

	// If selected base register contains the value of another register, use it instead
	if(genReg[base].type == x86Argument::argReg)
	{
		base = genReg[base].reg;
	}

	// If the base register contains a known value, add it to the offset and don't use the base register
	if(genReg[base].type == x86Argument::argNumber)
	{
		shift += genReg[base].num;
		base = rNONE;
	}

	// If the index register contains a known value, add it to the offset and don't use the index register
	if(genReg[index].type == x86Argument::argNumber)
	{
		shift += genReg[index].num * multiplier;
		multiplier = 1;
		index = rNONE;
	}
}